

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O0

void __thiscall capnp::MallocMessageBuilder::~MallocMessageBuilder(MallocMessageBuilder *this)

{
  void *__s;
  bool bVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  void **ppvVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  void *ptr;
  void **__end2;
  void **__begin2;
  Vector<void_*> *__range2;
  Fault f;
  word *local_60;
  undefined1 local_58 [8];
  DebugComparison<const_capnp::word_*,_void_*&> _kjCondition;
  undefined1 local_20 [8];
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments;
  MallocMessageBuilder *this_local;
  
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__MallocMessageBuilder_0029f160;
  segments.size_ = (size_t)this;
  if ((this->returnedFirstSegment & 1U) != 0) {
    if ((this->ownFirstSegment & 1U) == 0) {
      AVar5 = MessageBuilder::getSegmentsForOutput(&this->super_MessageBuilder);
      segments.ptr = (ArrayPtr<const_capnp::word> *)AVar5.size_;
      local_20 = (undefined1  [8])AVar5.ptr;
      sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)local_20);
      if (sVar2 != 0) {
        pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                           ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)local_20,0);
        f.exception = (Exception *)kj::ArrayPtr<const_capnp::word>::begin(pAVar3);
        local_60 = (word *)kj::_::DebugExpressionStart::operator<<
                                     ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(word **)&f);
        kj::_::DebugExpression<capnp::word_const*>::operator==
                  ((DebugComparison<const_capnp::word_*,_void_*&> *)local_58,
                   (DebugExpression<capnp::word_const*> *)&local_60,&this->firstSegment);
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::word_const*,void*&>&,char_const(&)[76]>
                    ((Fault *)&__range2,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/message.c++"
                     ,0xed,FAILED,"segments[0].begin() == firstSegment",
                     "_kjCondition,\"First segment in getSegmentsForOutput() is not the first segment allocated?\""
                     ,(DebugComparison<const_capnp::word_*,_void_*&> *)local_58,
                     (char (*) [76])
                     "First segment in getSegmentsForOutput() is not the first segment allocated?");
          kj::_::Debug::Fault::fatal((Fault *)&__range2);
        }
        __s = this->firstSegment;
        pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::operator[]
                           ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)local_20,0);
        sVar2 = kj::ArrayPtr<const_capnp::word>::size(pAVar3);
        memset(__s,0,sVar2 << 3);
      }
    }
    else {
      free(this->firstSegment);
    }
    __end2 = kj::Vector<void_*>::begin(&this->moreSegments);
    ppvVar4 = kj::Vector<void_*>::end(&this->moreSegments);
    for (; __end2 != ppvVar4; __end2 = __end2 + 1) {
      free(*__end2);
    }
  }
  kj::Vector<void_*>::~Vector(&this->moreSegments);
  MessageBuilder::~MessageBuilder(&this->super_MessageBuilder);
  return;
}

Assistant:

MallocMessageBuilder::~MallocMessageBuilder() noexcept(false) {
  if (returnedFirstSegment) {
    if (ownFirstSegment) {
      free(firstSegment);
    } else {
      // Must zero first segment.
      kj::ArrayPtr<const kj::ArrayPtr<const word>> segments = getSegmentsForOutput();
      if (segments.size() > 0) {
        KJ_ASSERT(segments[0].begin() == firstSegment,
            "First segment in getSegmentsForOutput() is not the first segment allocated?");
        memset(firstSegment, 0, segments[0].size() * sizeof(word));
      }
    }

    for (void* ptr: moreSegments) {
      free(ptr);
    }
  }
}